

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
io_object_impl<asio::io_context>
          (io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
           *this,int param_2,int param_3,io_context *context)

{
  resolver_service<asio::ip::tcp> *prVar1;
  undefined8 *in_RDI;
  io_context *in_stack_ffffffffffffffa8;
  resolver_service_base *this_00;
  constraint_t<conditional_t<_is_same<basic_executor_type<allocator<void>,_0UL>,_any_io_executor>::value_&&__is_base_of<execution::detail::any_executor_base,_basic_executor_type<allocator<void>,_0UL>_>::value,_execution::detail::is_valid_target_executor<basic_executor_type<allocator<void>,_0UL>,_supportable_properties_type>,_false_type>::value>
  in_stack_ffffffffffffffd4;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_ffffffffffffffd8;
  basic_executor_type<std::allocator<void>,_0UL> in_stack_ffffffffffffffe0;
  
  prVar1 = use_service<asio::detail::resolver_service<asio::ip::tcp>>((io_context *)0x71c4ca);
  *in_RDI = prVar1;
  this_00 = (resolver_service_base *)(in_RDI + 1);
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)0x71c4e0);
  asio::io_context::get_executor(in_stack_ffffffffffffffa8);
  any_io_executor::
  any_io_executor<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
            ((any_io_executor *)in_stack_ffffffffffffffe0.target_,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffe0);
  resolver_service_base::construct(this_00,(implementation_type *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

explicit io_object_impl(int, int, ExecutionContext& context)
    : service_(&asio::use_service<IoObjectService>(context)),
      executor_(context.get_executor())
  {
    service_->construct(implementation_);
  }